

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateTests.cpp
# Opt level: O1

void vkt::DynamicState::anon_unknown_1::createChildren(TestCaseGroup *group)

{
  TestContext *testCtx;
  TestNode *pTVar1;
  
  testCtx = (group->super_TestNode).m_testCtx;
  pTVar1 = (TestNode *)operator_new(0x70);
  DynamicStateVPTests::DynamicStateVPTests((DynamicStateVPTests *)pTVar1,testCtx);
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  DynamicStateRSTests::DynamicStateRSTests((DynamicStateRSTests *)pTVar1,testCtx);
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  DynamicStateCBTests::DynamicStateCBTests((DynamicStateCBTests *)pTVar1,testCtx);
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  DynamicStateDSTests::DynamicStateDSTests((DynamicStateDSTests *)pTVar1,testCtx);
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  DynamicStateGeneralTests::DynamicStateGeneralTests((DynamicStateGeneralTests *)pTVar1,testCtx);
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  return;
}

Assistant:

void createChildren (tcu::TestCaseGroup* group)
{
	tcu::TestContext&	testCtx		= group->getTestContext();

	group->addChild(new DynamicStateVPTests(testCtx));
	group->addChild(new DynamicStateRSTests(testCtx));
	group->addChild(new DynamicStateCBTests(testCtx));
	group->addChild(new DynamicStateDSTests(testCtx));
	group->addChild(new DynamicStateGeneralTests(testCtx));
}